

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.cpp
# Opt level: O2

shared_ptr<BER_CONTAINER> __thiscall IntegerCallback::buildTypeWithValue(IntegerCallback *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long in_RSI;
  shared_ptr<BER_CONTAINER> sVar2;
  shared_ptr<IntegerType> val;
  _func_int **local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  if (*(long *)(in_RSI + 0x18) == 0) {
    (this->super_ValueCallback)._vptr_ValueCallback = (_func_int **)0x0;
    (this->super_ValueCallback).OID = (SortableOIDType *)0x0;
  }
  else {
    std::make_shared<IntegerType,int&>((int *)&local_28);
    _Var1._M_pi = local_20._M_pi;
    if (*(int *)(in_RSI + 0x20) != 0) {
      *(int *)(local_28 + 2) = *(int *)(local_28 + 2) / *(int *)(in_RSI + 0x20);
    }
    (this->super_ValueCallback)._vptr_ValueCallback = local_28;
    local_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_ValueCallback).OID = (SortableOIDType *)_Var1._M_pi;
    local_28 = (_func_int **)0x0;
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
    in_RDX._M_pi = extraout_RDX;
  }
  sVar2.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar2.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<BER_CONTAINER>)
         sVar2.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BER_CONTAINER> IntegerCallback::buildTypeWithValue(){
    ASSERT_VALID_VALUE(this->value);

    auto val = std::make_shared<IntegerType>(*this->value);
    if(this->modifier != 0){
        // Apple local division if callback was asked to
        val->_value /= this->modifier;
    }
    return val;
}